

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

void __thiscall CVmObjVector::alloc_vector(CVmObjVector *this,size_t cnt)

{
  int iVar1;
  CVmObjVector *this_00;
  size_t sVar2;
  undefined4 extraout_var;
  long in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  this_00 = (CVmObjVector *)CVmMemory::get_var_heap(G_mem_X);
  sVar2 = calc_alloc(0x3a1c26);
  iVar1 = (*(this_00->super_CVmObjCollection).super_CVmObject._vptr_CVmObject[4])
                    (this_00,sVar2,in_RDI);
  *(ulong *)(in_RDI + 8) = CONCAT44(extraout_var,iVar1);
  set_allocated_count(this_00,in_stack_ffffffffffffffd8);
  set_element_count(this_00,in_stack_ffffffffffffffd8);
  clear_undo_bits(this_00);
  return;
}

Assistant:

void CVmObjVector::alloc_vector(VMG_ size_t cnt)
{
    /* allocate space for the given number of elements */
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(calc_alloc(cnt), this);

    /* set the element count and allocated count */
    set_allocated_count(cnt);
    set_element_count(cnt);

    /* clear the undo bits */
    clear_undo_bits();
}